

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1d734c9::AV1FwdTxfm2dTest_match_Test::TestBody(AV1FwdTxfm2dTest_match_Test *this)

{
  byte bVar1;
  bool bVar2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  undefined8 *puVar4;
  uint32_t uVar5;
  int iVar6;
  ParamType *pPVar7;
  undefined1 *puVar8;
  size_t sVar9;
  int c;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int *rhs;
  ulong uVar13;
  SEARCH_METHODS *message;
  ulong uVar14;
  char *__s;
  int *lhs;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar31;
  undefined1 auVar30 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar32 [16];
  int iVar33;
  int iVar35;
  int iVar36;
  int iVar37;
  undefined1 auVar34 [16];
  AssertionResult gtest_ar;
  ACMRandom rnd;
  TxfmParam param;
  int16_t input [4096];
  int32_t ref_output [4096];
  int32_t output [4096];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a138;
  int local_a12c;
  ulong local_a128;
  long local_a120;
  internal local_a118 [8];
  undefined8 *local_a110;
  int local_a104;
  int local_a100;
  uint local_a0fc;
  uint local_a0f8;
  Random local_a0f4;
  ulong local_a0f0;
  ulong local_a0e8;
  undefined1 local_a0e0 [16];
  txfm_param local_a0d0;
  long local_a0b8;
  _func_void_short_ptr_int_ptr_int_txfm_param_ptr *local_a0b0;
  code *local_a0a8;
  long local_a0a0;
  ulong local_a098;
  long local_a090;
  int *local_a088;
  int *local_a080;
  ulong local_a078;
  long local_a070;
  AssertHelper local_a068;
  ushort local_a060 [448];
  undefined1 local_9ce0 [7296];
  int local_8060 [4096];
  int local_4060 [4108];
  long lVar17;
  
  pPVar7 = testing::
           WithParamInterface<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
           ::GetParam();
  bVar1 = (pPVar7->
          super__Tuple_impl<0UL,_unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>).
          super__Head_base<0UL,_unsigned_char,_false>._M_head_impl;
  uVar14 = (ulong)bVar1;
  pPVar7 = testing::
           WithParamInterface<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
           ::GetParam();
  local_a0b0 = (pPVar7->
               super__Tuple_impl<0UL,_unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>
               ).super__Tuple_impl<1UL,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>.
               super__Head_base<1UL,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*),_false>.
               _M_head_impl;
  local_a0d0.tx_type = '\0';
  local_a0d0.tx_size = '\0';
  local_a0d0._2_2_ = 0;
  local_a0d0.lossless = 0;
  local_a0d0.bd = 0;
  local_a0d0.is_hbd = 0;
  local_a0d0.tx_set_type = '\0';
  local_a0d0._17_3_ = 0;
  local_a0d0.eob = 0;
  uVar15 = (ulong)((uint)bVar1 * 4);
  local_a0f8 = *(uint *)((long)::tx_size_wide + uVar15);
  uVar11 = 0;
  iVar6 = (uint)((0x18608UL >> (uVar14 & 0x3f) & 1) == 0) * 4 + 1;
  if ((0x61810UL >> (uVar14 & 0x3f) & 1) != 0) {
    iVar6 = 0;
  }
  uVar13 = 0x20;
  if ((int)local_a0f8 < 0x20) {
    uVar13 = (ulong)local_a0f8;
  }
  local_a0fc = *(uint *)((long)::tx_size_high + uVar15);
  local_a104 = local_a0f8 * local_a0fc;
  uVar15 = 1;
  if (1 < (int)local_a0f8) {
    uVar15 = (ulong)local_a0f8;
  }
  local_a078 = 1;
  if (1 < (int)local_a0fc) {
    local_a078 = (ulong)local_a0fc;
  }
  local_a100 = (int)uVar13;
  local_a120 = (long)local_a100;
  uVar10 = 1;
  if (1 < local_a100) {
    uVar10 = uVar13;
  }
  lVar12 = local_a078 - 1;
  local_a0b8 = (long)av1_ext_tx_used[0] + (ulong)(uint)(iVar6 << 6);
  local_a0e0._8_4_ = (int)lVar12;
  local_a0e0._0_8_ = lVar12;
  local_a0e0._12_4_ = (int)((ulong)lVar12 >> 0x20);
  local_a090 = (ulong)((int)local_a078 + 7U & 0xfffffff8) << 7;
  local_a070 = uVar10 - 1;
  local_a0e0 = local_a0e0 ^ _DAT_00c30d80;
  local_a0a0 = local_a120 * 4;
  local_a0f0 = uVar14;
  do {
    if (*(int *)(local_a0b8 + uVar11 * 4) != 0) {
      local_a0a8 = *(code **)(libaom_test::fwd_txfm_func_ls + local_a0f0 * 8);
      memset(local_a060,0,0x2000);
      iVar6 = 0;
      local_a0f4.state_ = 0xbaba;
      local_a128 = uVar11;
      do {
        local_a12c = iVar6;
        if (iVar6 == 0) {
          puVar8 = local_9ce0;
          uVar11 = 0;
          do {
            lVar12 = 0;
            auVar16 = _DAT_00c40100;
            auVar18 = _DAT_00c400f0;
            auVar19 = _DAT_00c400e0;
            auVar20 = _DAT_00c400d0;
            do {
              auVar21 = auVar16 ^ _DAT_00c30d80;
              iVar33 = local_a0e0._0_4_;
              iVar6 = -(uint)(iVar33 < auVar21._0_4_);
              iVar35 = local_a0e0._4_4_;
              auVar22._4_4_ = -(uint)(iVar35 < auVar21._4_4_);
              iVar36 = local_a0e0._8_4_;
              iVar31 = -(uint)(iVar36 < auVar21._8_4_);
              iVar37 = local_a0e0._12_4_;
              auVar22._12_4_ = -(uint)(iVar37 < auVar21._12_4_);
              auVar27._4_4_ = iVar6;
              auVar27._0_4_ = iVar6;
              auVar27._8_4_ = iVar31;
              auVar27._12_4_ = iVar31;
              auVar32 = pshuflw(in_XMM7,auVar27,0xe8);
              auVar26._4_4_ = -(uint)(auVar21._4_4_ == iVar35);
              auVar26._12_4_ = -(uint)(auVar21._12_4_ == iVar37);
              auVar26._0_4_ = auVar26._4_4_;
              auVar26._8_4_ = auVar26._12_4_;
              auVar34 = pshuflw(local_a0e0,auVar26,0xe8);
              auVar22._0_4_ = auVar22._4_4_;
              auVar22._8_4_ = auVar22._12_4_;
              auVar21 = pshuflw(auVar32,auVar22,0xe8);
              auVar21 = (auVar21 | auVar34 & auVar32) ^ _DAT_00d01b80;
              auVar21 = packssdw(auVar21,auVar21);
              if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(puVar8 + lVar12 + -0x380) = 0xff;
              }
              auVar22 = auVar26 & auVar27 | auVar22;
              auVar21 = packssdw(auVar22,auVar22);
              auVar21 = packssdw(auVar21 ^ _DAT_00d01b80,auVar21 ^ _DAT_00d01b80);
              if ((auVar21._0_4_ >> 0x10 & 1) != 0) {
                *(undefined2 *)(puVar8 + lVar12 + -0x300) = 0xff;
              }
              auVar26 = auVar18 ^ _DAT_00c30d80;
              iVar6 = -(uint)(iVar33 < auVar26._0_4_);
              auVar34._4_4_ = -(uint)(iVar35 < auVar26._4_4_);
              iVar31 = -(uint)(iVar36 < auVar26._8_4_);
              auVar34._12_4_ = -(uint)(iVar37 < auVar26._12_4_);
              auVar21._4_4_ = iVar6;
              auVar21._0_4_ = iVar6;
              auVar21._8_4_ = iVar31;
              auVar21._12_4_ = iVar31;
              auVar32._4_4_ = -(uint)(auVar26._4_4_ == iVar35);
              auVar32._12_4_ = -(uint)(auVar26._12_4_ == iVar37);
              auVar32._0_4_ = auVar32._4_4_;
              auVar32._8_4_ = auVar32._12_4_;
              auVar34._0_4_ = auVar34._4_4_;
              auVar34._8_4_ = auVar34._12_4_;
              auVar26 = auVar32 & auVar21 | auVar34;
              auVar26 = packssdw(auVar26,auVar26);
              auVar26 = packssdw(auVar26 ^ _DAT_00d01b80,auVar26 ^ _DAT_00d01b80);
              if ((auVar26 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined2 *)(puVar8 + lVar12 + -0x280) = 0xff;
              }
              auVar21 = pshufhw(auVar21,auVar21,0x84);
              auVar27 = pshufhw(auVar32,auVar32,0x84);
              auVar22 = pshufhw(auVar21,auVar34,0x84);
              auVar21 = (auVar22 | auVar27 & auVar21) ^ _DAT_00d01b80;
              auVar21 = packssdw(auVar21,auVar21);
              if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined2 *)(puVar8 + lVar12 + -0x200) = 0xff;
              }
              auVar21 = auVar19 ^ _DAT_00c30d80;
              iVar6 = -(uint)(iVar33 < auVar21._0_4_);
              auVar24._4_4_ = -(uint)(iVar35 < auVar21._4_4_);
              iVar31 = -(uint)(iVar36 < auVar21._8_4_);
              auVar24._12_4_ = -(uint)(iVar37 < auVar21._12_4_);
              auVar28._4_4_ = iVar6;
              auVar28._0_4_ = iVar6;
              auVar28._8_4_ = iVar31;
              auVar28._12_4_ = iVar31;
              auVar26 = pshuflw(auVar26,auVar28,0xe8);
              auVar23._4_4_ = -(uint)(auVar21._4_4_ == iVar35);
              auVar23._12_4_ = -(uint)(auVar21._12_4_ == iVar37);
              auVar23._0_4_ = auVar23._4_4_;
              auVar23._8_4_ = auVar23._12_4_;
              auVar22 = pshuflw(local_a0e0,auVar23,0xe8);
              auVar24._0_4_ = auVar24._4_4_;
              auVar24._8_4_ = auVar24._12_4_;
              auVar21 = pshuflw(auVar26,auVar24,0xe8);
              auVar21 = (auVar21 | auVar22 & auVar26) ^ _DAT_00d01b80;
              auVar21 = packssdw(auVar21,auVar21);
              if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)(puVar8 + lVar12 + -0x180) = 0xff;
              }
              auVar24 = auVar23 & auVar28 | auVar24;
              auVar21 = packssdw(auVar24,auVar24);
              auVar21 = packssdw(auVar21 ^ _DAT_00d01b80,auVar21 ^ _DAT_00d01b80);
              if ((auVar21 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                *(undefined2 *)(puVar8 + lVar12 + -0x100) = 0xff;
              }
              auVar21 = auVar20 ^ _DAT_00c30d80;
              iVar6 = -(uint)(iVar33 < auVar21._0_4_);
              auVar30._4_4_ = -(uint)(iVar35 < auVar21._4_4_);
              iVar31 = -(uint)(iVar36 < auVar21._8_4_);
              auVar30._12_4_ = -(uint)(iVar37 < auVar21._12_4_);
              auVar25._4_4_ = iVar6;
              auVar25._0_4_ = iVar6;
              auVar25._8_4_ = iVar31;
              auVar25._12_4_ = iVar31;
              auVar29._4_4_ = -(uint)(auVar21._4_4_ == iVar35);
              auVar29._12_4_ = -(uint)(auVar21._12_4_ == iVar37);
              auVar29._0_4_ = auVar29._4_4_;
              auVar29._8_4_ = auVar29._12_4_;
              auVar30._0_4_ = auVar30._4_4_;
              auVar30._8_4_ = auVar30._12_4_;
              auVar21 = auVar29 & auVar25 | auVar30;
              auVar21 = packssdw(auVar21,auVar21);
              in_XMM7 = packssdw(auVar21 ^ _DAT_00d01b80,auVar21 ^ _DAT_00d01b80);
              if ((in_XMM7 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined2 *)(puVar8 + lVar12 + -0x80) = 0xff;
              }
              auVar21 = pshufhw(auVar25,auVar25,0x84);
              auVar22 = pshufhw(auVar29,auVar29,0x84);
              auVar26 = pshufhw(auVar21,auVar30,0x84);
              auVar21 = (auVar26 | auVar22 & auVar21) ^ _DAT_00d01b80;
              auVar21 = packssdw(auVar21,auVar21);
              if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined2 *)(puVar8 + lVar12) = 0xff;
              }
              lVar17 = auVar16._8_8_;
              auVar16._0_8_ = auVar16._0_8_ + 8;
              auVar16._8_8_ = lVar17 + 8;
              lVar17 = auVar18._8_8_;
              auVar18._0_8_ = auVar18._0_8_ + 8;
              auVar18._8_8_ = lVar17 + 8;
              lVar17 = auVar19._8_8_;
              auVar19._0_8_ = auVar19._0_8_ + 8;
              auVar19._8_8_ = lVar17 + 8;
              lVar17 = auVar20._8_8_;
              auVar20._0_8_ = auVar20._0_8_ + 8;
              auVar20._8_8_ = lVar17 + 8;
              lVar12 = lVar12 + 0x400;
            } while (local_a090 != lVar12);
            uVar11 = uVar11 + 1;
            puVar8 = puVar8 + 2;
          } while (uVar11 != uVar15);
        }
        else {
          uVar11 = 0;
          do {
            uVar14 = 0;
            do {
              uVar5 = testing::internal::Random::Generate(&local_a0f4,0x80000000);
              local_a060[(ulong)((uint)uVar11 & 0x3ffffff) * 0x40 + uVar14] =
                   (ushort)(uVar5 >> 0xf) & 0xff;
              uVar14 = uVar14 + 1;
            } while (uVar15 != uVar14);
            uVar11 = uVar11 + 1;
          } while (uVar11 != local_a078);
        }
        uVar11 = local_a128;
        local_a0d0.tx_size = (TX_SIZE)local_a0f0;
        local_a0d0.tx_type = (TX_TYPE)local_a128;
        local_a0d0.tx_set_type = '\x05';
        local_a0d0.bd = 8;
        (*local_a0a8)(local_a060,local_8060,0x40,local_a128 & 0xff,8);
        (*local_a0b0)((short *)local_a060,local_4060,0x40,&local_a0d0);
        iVar6 = (int)((long)local_a104 / (long)local_a100);
        if (0 < iVar6) {
          local_a098 = (long)local_a104 / (long)local_a100 & 0xffffffff;
          if (0x1f < iVar6) {
            local_a098 = 0x20;
          }
          lhs = local_8060 + 1;
          rhs = local_4060 + 1;
          uVar14 = 0;
          do {
            testing::internal::CmpHelperEQ<int,int>
                      (local_a118,"ref_output[r * check_cols + c]","output[r * check_cols + c]",
                       local_8060 + uVar14 * local_a120,local_4060 + uVar14 * local_a120);
            local_a0e8 = uVar14;
            local_a088 = rhs;
            local_a080 = lhs;
            if (local_a118[0] == (internal)0x1) {
              lVar12 = 0;
              do {
                puVar4 = local_a110;
                if (local_a110 != (undefined8 *)0x0) {
                  if ((undefined8 *)*local_a110 != local_a110 + 2) {
                    operator_delete((undefined8 *)*local_a110);
                  }
                  operator_delete(puVar4);
                }
                if (local_a070 == lVar12) {
                  bVar2 = lVar12 + 1 < local_a120;
                  iVar6 = 0x17;
                  uVar11 = local_a128;
                  goto LAB_006e7199;
                }
                testing::internal::CmpHelperEQ<int,int>
                          (local_a118,"ref_output[r * check_cols + c]","output[r * check_cols + c]",
                           lhs,rhs);
                rhs = rhs + 1;
                lhs = lhs + 1;
                lVar12 = lVar12 + 1;
              } while (local_a118[0] != (internal)0x0);
              bVar2 = lVar12 < local_a120;
              uVar11 = local_a128;
            }
            else {
              bVar2 = true;
              lVar12 = 0;
            }
            testing::Message::Message((Message *)&local_a138);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_a138._M_head_impl + 0x10),"[",1);
            std::ostream::operator<<(local_a138._M_head_impl + 0x10,(int)local_a0e8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_a138._M_head_impl + 0x10),",",1);
            std::ostream::operator<<(local_a138._M_head_impl + 0x10,(int)lVar12);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_a138._M_head_impl + 0x10),"] cnt:",6);
            std::ostream::operator<<(local_a138._M_head_impl + 0x10,local_a12c);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_a138._M_head_impl + 0x10)," tx_size: ",10);
            std::ostream::operator<<(local_a138._M_head_impl + 0x10,local_a0f8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_a138._M_head_impl + 0x10),"x",1);
            std::ostream::operator<<(local_a138._M_head_impl + 0x10,local_a0fc);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_a138._M_head_impl + 0x10)," tx_type: ",10);
            _Var3._M_head_impl = local_a138._M_head_impl;
            __s = *(char **)(libaom_test::tx_type_name + uVar11 * 8);
            if (__s == (char *)0x0) {
              sVar9 = 6;
              __s = "(null)";
            }
            else {
              sVar9 = strlen(__s);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(_Var3._M_head_impl + 0x10),__s,sVar9);
            message = "";
            if (local_a110 != (undefined8 *)0x0) {
              message = (SEARCH_METHODS *)*local_a110;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_a068,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_fwd_txfm2d_test.cc"
                       ,0x11f,(char *)message);
            testing::internal::AssertHelper::operator=(&local_a068,(Message *)&local_a138);
            testing::internal::AssertHelper::~AssertHelper(&local_a068);
            if (local_a138._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_a138._M_head_impl + 8))();
            }
            puVar4 = local_a110;
            if (local_a110 != (undefined8 *)0x0) {
              if ((undefined8 *)*local_a110 != local_a110 + 2) {
                operator_delete((undefined8 *)*local_a110);
              }
              operator_delete(puVar4);
            }
            iVar6 = 1;
LAB_006e7199:
            if (bVar2) goto LAB_006e71d7;
            uVar14 = local_a0e8 + 1;
            rhs = (int *)((long)local_a088 + local_a0a0);
            lhs = (int *)((long)local_a080 + local_a0a0);
          } while (uVar14 != local_a098);
        }
        iVar6 = 0x14;
LAB_006e71d7:
        if (iVar6 != 0x14) goto LAB_006e71f2;
        iVar6 = local_a12c + 1;
      } while (iVar6 != 500);
      iVar6 = 5;
LAB_006e71f2:
      if ((iVar6 != 5) && (iVar6 != 0)) {
        return;
      }
    }
    uVar11 = uVar11 + 1;
    if (uVar11 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

TEST_P(AV1FwdTxfm2dTest, match) {
  AV1FwdTxfm2dMatchTest(GET_PARAM(0), GET_PARAM(1));
}